

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall
Assimp::ColladaParser::ReadMaterialVertexInputBinding(ColladaParser *this,SemanticMappingTable *tbl)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  InputType IVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Logger *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  mapped_type *pmVar5;
  ColladaParser *this_01;
  ulong uVar6;
  string s;
  allocator<char> local_71;
  key_type local_70;
  _Alloc_hider local_50;
  undefined8 local_40;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 != '\0') {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        if (iVar2 != 1) {
LAB_003ce221:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"bind_vertex_input");
        if (iVar1 == 0) {
          uVar3 = GetAttribute(this,"semantic");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,(char *)CONCAT44(extraout_var_02,iVar1),
                     (allocator<char> *)&stack0xffffffffffffffb0);
          uVar3 = GetAttribute(this,"input_semantic");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          this_01 = (ColladaParser *)&stack0xffffffffffffffb0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xffffffffffffffb0,(char *)CONCAT44(extraout_var_03,iVar1),
                     &local_71);
          IVar4 = GetTypeForSemantic(this_01,(string *)&stack0xffffffffffffffb0);
          if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
            operator_delete(local_50._M_p,local_40 + 1);
          }
          uVar3 = TestAttribute(this,"input_set");
          if (uVar3 == 0xffffffff) {
            uVar6 = 0;
          }
          else {
            uVar3 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar3);
            uVar6 = (ulong)uVar3;
          }
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>_>
                   ::operator[](&tbl->mMap,&local_70);
          *pmVar5 = (mapped_type)(uVar6 | (ulong)IVar4 << 0x20);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar1 != 1) goto LAB_003ce221;
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar1 = strcmp((char *)CONCAT44(extraout_var_00,iVar1),"bind");
          if (iVar1 == 0) {
            this_00 = DefaultLogger::get();
            Logger::warn(this_00,"Collada: Found unsupported <bind> element");
          }
        }
      }
      else if (iVar2 == 2) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var_01,iVar1),"instance_material");
        if (iVar1 == 0) {
          return;
        }
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadMaterialVertexInputBinding(Collada::SemanticMappingTable& tbl)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("bind_vertex_input"))
            {
                Collada::InputSemanticMapEntry vn;

                // effect semantic
                int n = GetAttribute("semantic");
                std::string s = mReader->getAttributeValue(n);

                // input semantic
                n = GetAttribute("input_semantic");
                vn.mType = GetTypeForSemantic(mReader->getAttributeValue(n));

                // index of input set
                n = TestAttribute("input_set");
                if (-1 != n)
                    vn.mSet = mReader->getAttributeValueAsInt(n);

                tbl.mMap[s] = vn;
            }
            else if (IsElement("bind")) {
                ASSIMP_LOG_WARN("Collada: Found unsupported <bind> element");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "instance_material") == 0)
                break;
        }
    }
}